

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall node::BlockManager::FlushUndoFile(BlockManager *this,int block_file,bool finalize)

{
  FlatFilePos FVar1;
  ConstevalStringLiteral str;
  bool bVar2;
  undefined1 in_DL;
  undefined4 in_ESI;
  FlatFilePos *in_RDI;
  long in_FS_OFFSET;
  FlatFilePos undo_pos_old;
  bilingual_str *in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined3 in_stack_ffffffffffffff98;
  uint uVar3;
  FlatFilePos *pos;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffff98) & 0x1ffffff;
  pos = in_RDI;
  std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
            ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50
            );
  FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_ffffffffffffff48,0,0x37933e);
  bVar2 = FlatFileSeq::Flush((FlatFileSeq *)
                             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),pos,
                             SUB41((uint)in_ESI >> 0x18,0));
  if (!bVar2) {
    FVar1 = in_RDI[0x2b];
    str.lit._4_4_ = in_ESI;
    str.lit._0_4_ = uVar3;
    ::_(str);
    (**(code **)(*(long *)FVar1 + 0x38))(FVar1,local_48);
    bilingual_str::~bilingual_str(in_stack_ffffffffffffff48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool BlockManager::FlushUndoFile(int block_file, bool finalize)
{
    FlatFilePos undo_pos_old(block_file, m_blockfile_info[block_file].nUndoSize);
    if (!m_undo_file_seq.Flush(undo_pos_old, finalize)) {
        m_opts.notifications.flushError(_("Flushing undo file to disk failed. This is likely the result of an I/O error."));
        return false;
    }
    return true;
}